

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebra.cpp
# Opt level: O0

uint __thiscall Shell::TermAlgebra::getSubtermPredicate(TermAlgebra *this)

{
  uint uVar1;
  undefined4 uVar2;
  size_t sVar3;
  TermList *pTVar4;
  Symbol *this_00;
  TermStack args;
  uint s;
  bool added;
  bool *in_stack_000001f0;
  uint in_stack_000001fc;
  string *in_stack_00000200;
  Signature *in_stack_00000208;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  TermList in_stack_ffffffffffffff40;
  uint taArity;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  Stack<Kernel::TermList> *in_stack_ffffffffffffff50;
  Stack<Kernel::TermList> local_60;
  string local_30 [32];
  uint local_10;
  byte local_9;
  uint arity;
  
  getSubtermPredicateName_abi_cxx11_
            ((TermAlgebra *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  nTypeArgs((TermAlgebra *)0xd0f1d3);
  uVar1 = Kernel::Signature::addPredicate
                    (in_stack_00000208,in_stack_00000200,in_stack_000001fc,in_stack_000001f0);
  std::__cxx11::string::~string(local_30);
  local_10 = uVar1;
  if ((local_9 & 1) != 0) {
    Lib::Stack<Kernel::TermList>::Stack
              (in_stack_ffffffffffffff50,
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    Lib::Stack<Kernel::TermList>::push
              ((Stack<Kernel::TermList> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff40);
    Lib::Stack<Kernel::TermList>::push
              ((Stack<Kernel::TermList> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff40);
    Kernel::Signature::getPredicate
              ((Signature *)in_stack_ffffffffffffff40._content,in_stack_ffffffffffffff3c);
    taArity = (uint)(in_stack_ffffffffffffff40._content >> 0x20);
    sVar3 = Lib::Stack<Kernel::TermList>::size(&local_60);
    uVar2 = (undefined4)sVar3;
    pTVar4 = Lib::Stack<Kernel::TermList>::begin(&local_60);
    arity = (uint)((ulong)pTVar4 >> 0x20);
    uVar1 = nTypeArgs((TermAlgebra *)0xd0f2c8);
    this_00 = (Symbol *)
              Kernel::OperatorType::getPredicateType
                        (arity,(TermList *)CONCAT44(uVar2,uVar1),taArity);
    Kernel::Signature::Symbol::setType
              (this_00,(OperatorType *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
              );
    Lib::Stack<Kernel::TermList>::~Stack((Stack<Kernel::TermList> *)this_00);
  }
  return local_10;
}

Assistant:

unsigned TermAlgebra::getSubtermPredicate() {
  bool added;
  unsigned s = env.signature->addPredicate(getSubtermPredicateName(), nTypeArgs()+2, added);

  if (added) {
    // declare a binary predicate subterm
    TermStack args;
    args.push(_sort);
    args.push(_sort);
    env.signature->getPredicate(s)->setType(OperatorType::getPredicateType(args.size(),args.begin(),nTypeArgs()));
  }

  return s;
}